

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::CostAttributes::initializeCost
          (CostAttributes *this,MatrixDynSize *inputSelector)

{
  uint rangeSize;
  uint totalDimension;
  __shared_ptr<iDynTree::optimalcontrol::MatrixSelector,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::make_shared<iDynTree::optimalcontrol::MatrixSelector,iDynTree::MatrixDynSize_const&>
            ((MatrixDynSize *)&_Stack_28);
  std::__shared_ptr<iDynTree::optimalcontrol::Selector,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<iDynTree::optimalcontrol::Selector,(__gnu_cxx::_Lock_policy)2> *)
             &this->selector,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  rangeSize = iDynTree::MatrixDynSize::rows();
  totalDimension = iDynTree::MatrixDynSize::cols();
  initializeBuffers(this,rangeSize,totalDimension);
  return;
}

Assistant:

void initializeCost(const MatrixDynSize& inputSelector) {
                this->selector = std::make_shared<MatrixSelector>(inputSelector);
                unsigned int rangeSize = inputSelector.rows();
                unsigned int totalDimension = inputSelector.cols();
                initializeBuffers(rangeSize, totalDimension);
            }